

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O2

void __thiscall ABlasterFX1::Effect(ABlasterFX1 *this)

{
  double dVar1;
  int iVar2;
  FName local_2c;
  DVector3 local_28;
  
  iVar2 = FRandom::operator()(&pr_bfx1t);
  if (iVar2 < 0x40) {
    FName::FName(&local_2c,"BlasterSmoke");
    local_28.Z = (this->super_AFastProjectile).super_AActor.__Pos.Z + -8.0;
    dVar1 = (this->super_AFastProjectile).super_AActor.floorz;
    if (local_28.Z <= dVar1) {
      local_28.Z = dVar1;
    }
    local_28.X = (this->super_AFastProjectile).super_AActor.__Pos.X;
    local_28.Y = (this->super_AFastProjectile).super_AActor.__Pos.Y;
    Spawn(&local_2c,&local_28,ALLOW_REPLACE);
  }
  return;
}

Assistant:

void ABlasterFX1::Effect ()
{
	if (pr_bfx1t() < 64)
	{
		Spawn("BlasterSmoke", PosAtZ(MAX(Z() - 8., floorz)), ALLOW_REPLACE);
	}
}